

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O1

unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> __thiscall
duckdb::ArrowType::GetTypeFromSchema(ArrowType *this,DBConfig *config,ArrowSchema *schema)

{
  ArrowType *__ptr_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  pointer pAVar4;
  pointer *__ptr_1;
  pointer *__ptr;
  string format;
  ArrowSchemaMetadata schema_metadata;
  ArrowTypeExtension extension;
  ArrowExtensionMetadata extension_info;
  undefined1 local_2d8 [16];
  string local_2c8;
  string local_2a8;
  undefined1 local_288 [64];
  ArrowTypeExtension local_248;
  ArrowExtensionMetadata local_1a8;
  ArrowExtensionMetadata local_128;
  ArrowExtensionMetadata local_a8;
  
  ::std::__cxx11::string::string
            ((string *)(local_2d8 + 0x10),schema->format,(allocator *)&local_248);
  ArrowSchemaMetadata::ArrowSchemaMetadata((ArrowSchemaMetadata *)local_288,schema->metadata);
  GetTypeFromFormat(this,config,schema,(string *)(local_2d8 + 0x10));
  bVar3 = ArrowSchemaMetadata::HasExtension((ArrowSchemaMetadata *)local_288);
  if (bVar3) {
    local_2a8._M_dataplus._M_p = local_2d8 + 0x40;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(local_2d8 + 0x30),local_2c8._M_dataplus._M_p,
               local_2c8._M_dataplus._M_p + local_2c8._M_string_length);
    ArrowSchemaMetadata::GetExtensionInfo
              (&local_1a8,(ArrowSchemaMetadata *)local_288,(string *)(local_2d8 + 0x30));
    if (local_2a8._M_dataplus._M_p != local_2d8 + 0x40) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    ArrowExtensionMetadata::ArrowExtensionMetadata(&local_a8,&local_1a8);
    bVar3 = DBConfig::HasArrowExtension(config,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.arrow_format._M_dataplus._M_p != &local_a8.arrow_format.field_2) {
      operator_delete(local_a8.arrow_format._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.type_name._M_dataplus._M_p != &local_a8.type_name.field_2) {
      operator_delete(local_a8.type_name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.vendor_name._M_dataplus._M_p != &local_a8.vendor_name.field_2) {
      operator_delete(local_a8.vendor_name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.extension_name._M_dataplus._M_p != &local_a8.extension_name.field_2) {
      operator_delete(local_a8.extension_name._M_dataplus._M_p);
    }
    if (bVar3) {
      ArrowExtensionMetadata::ArrowExtensionMetadata(&local_128,&local_1a8);
      DBConfig::GetArrowExtension(&local_248,config,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.arrow_format._M_dataplus._M_p != &local_128.arrow_format.field_2) {
        operator_delete(local_128.arrow_format._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.type_name._M_dataplus._M_p != &local_128.type_name.field_2) {
        operator_delete(local_128.type_name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.vendor_name._M_dataplus._M_p != &local_128.vendor_name.field_2) {
        operator_delete(local_128.vendor_name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.extension_name._M_dataplus._M_p != &local_128.extension_name.field_2) {
        operator_delete(local_128.extension_name._M_dataplus._M_p);
      }
      ArrowTypeExtension::GetType
                ((ArrowTypeExtension *)local_2d8,(ArrowSchema *)&local_248,
                 (ArrowSchemaMetadata *)schema);
      uVar1 = local_2d8._0_8_;
      local_2d8._0_8_ = (ArrowType *)0x0;
      __ptr_00 = (ArrowType *)
                 (this->extension_data).internal.
                 super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      (this->extension_data).internal.
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar1;
      if (__ptr_00 != (ArrowType *)0x0) {
        ::std::default_delete<duckdb::ArrowType>::operator()
                  ((default_delete<duckdb::ArrowType> *)this,__ptr_00);
      }
      if ((ArrowType *)local_2d8._0_8_ != (ArrowType *)0x0) {
        ::std::default_delete<duckdb::ArrowType>::operator()
                  ((default_delete<duckdb::ArrowType> *)local_2d8,(ArrowType *)local_2d8._0_8_);
      }
      ArrowTypeExtension::GetTypeExtension(&local_248);
      pAVar4 = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::
               operator->((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                           *)this);
      uVar2 = local_2d8._8_8_;
      uVar1 = local_2d8._0_8_;
      local_2d8._0_8_ = (element_type *)0x0;
      local_2d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (pAVar4->extension_data).internal.
                super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (pAVar4->extension_data).internal.
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar1;
      (pAVar4->extension_data).internal.
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
      }
      if (local_248.type_extension.internal.
          super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_248.type_extension.internal.
                   super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248.extension_metadata.arrow_format._M_dataplus._M_p !=
          &local_248.extension_metadata.arrow_format.field_2) {
        operator_delete(local_248.extension_metadata.arrow_format._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248.extension_metadata.type_name._M_dataplus._M_p !=
          &local_248.extension_metadata.type_name.field_2) {
        operator_delete(local_248.extension_metadata.type_name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248.extension_metadata.vendor_name._M_dataplus._M_p !=
          &local_248.extension_metadata.vendor_name.field_2) {
        operator_delete(local_248.extension_metadata.vendor_name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248.extension_metadata.extension_name._M_dataplus._M_p !=
          &local_248.extension_metadata.extension_name.field_2) {
        operator_delete(local_248.extension_metadata.extension_name._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.arrow_format._M_dataplus._M_p != &local_1a8.arrow_format.field_2) {
      operator_delete(local_1a8.arrow_format._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.type_name._M_dataplus._M_p != &local_1a8.type_name.field_2) {
      operator_delete(local_1a8.type_name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.vendor_name._M_dataplus._M_p != &local_1a8.vendor_name.field_2) {
      operator_delete(local_1a8.vendor_name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.extension_name._M_dataplus._M_p != &local_1a8.extension_name.field_2) {
      operator_delete(local_1a8.extension_name._M_dataplus._M_p);
    }
  }
  std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::~unique_ptr
            ((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_> *)
             (local_288 + 0x38));
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_288);
  if (local_2c8._M_dataplus._M_p != local_2d8 + 0x20) {
    operator_delete(local_2c8._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
         (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)this;
}

Assistant:

unique_ptr<ArrowType> ArrowType::GetTypeFromSchema(DBConfig &config, ArrowSchema &schema) {
	auto format = string(schema.format);
	// Let's first figure out if this type is an extension type
	ArrowSchemaMetadata schema_metadata(schema.metadata);
	auto arrow_type = GetTypeFromFormat(config, schema, format);
	if (schema_metadata.HasExtension()) {
		auto extension_info = schema_metadata.GetExtensionInfo(string(format));
		if (config.HasArrowExtension(extension_info)) {
			auto extension = config.GetArrowExtension(extension_info);
			arrow_type = extension.GetType(schema, schema_metadata);
			arrow_type->extension_data = extension.GetTypeExtension();
		}
	}

	return arrow_type;
}